

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O2

bool __thiscall doublechecked::Roaring::operator==(Roaring *this,Roaring *r)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = roaring::Roaring::operator==(&this->plain,&r->plain);
  bVar2 = std::operator==(&(this->check)._M_t,&(r->check)._M_t);
  _assert_true((ulong)(bVar2 == bVar1),"ans == (check == r.check)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring_checked.hh"
               ,0x15e);
  return bVar1;
}

Assistant:

bool operator==(const Roaring &r) const {
        bool ans = (plain == r.plain);
        assert_true(ans == (check == r.check));
        return ans;
    }